

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O1

bool adiak::
     value<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
               (string *name,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *value,int category,string *subcategory)

{
  bool bVar1;
  int iVar2;
  adiak_datatype_t *dtype;
  adiak_value_t *value_00;
  
  dtype = internal::
          create_container_type<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::make_type();
  if (dtype != (adiak_datatype_t *)0x0) {
    value_00 = (adiak_value_t *)malloc(8);
    bVar1 = internal::
            create_container_type<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::make_value(value,value_00,dtype);
    if (bVar1) {
      iVar2 = adiak_raw_namevalue((name->_M_dataplus)._M_p,category,(subcategory->_M_dataplus)._M_p,
                                  value_00,dtype);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }